

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure.c
# Opt level: O3

LY_ERR structure_aug_sprinter_ctree
                 (lysc_ext_instance *ext,lyspr_tree_ctx *ctx,char **flags,char **add_opts)

{
  lysp_ext_instance *plVar1;
  lysp_ext_instance *plVar2;
  int iVar3;
  LY_ERR LVar4;
  char **ppcVar5;
  lysp_ext_instance *plVar6;
  
  if (ctx == (lyspr_tree_ctx *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_exts/structure.c"
                  ,499,
                  "LY_ERR structure_aug_sprinter_ctree(struct lysc_ext_instance *, const struct lyspr_tree_ctx *, const char **, const char **)"
                 );
  }
  plVar1 = ext->module->parsed->exts;
  if ((plVar1 != (lysp_ext_instance *)0x0) &&
     (plVar2 = plVar1[-1].exts, plVar2 != (lysp_ext_instance *)0x0)) {
    ppcVar5 = &plVar1->argument;
    plVar6 = (lysp_ext_instance *)0x0;
    do {
      iVar3 = strcmp(((lysp_ext_instance *)(ppcVar5 + -1))->name,"sx:augment-structure");
      if (iVar3 == 0) {
        iVar3 = strcmp(*ppcVar5,ext->argument);
        if (iVar3 == 0) {
          if (plVar6 < plVar2) {
            LVar4 = lyplg_ext_sprinter_ptree_add_nodes
                              (ctx,*(lysp_node **)((long)*plVar1->substmts[0xc].storage_p + 0x40),
                               structure_sprinter_pnode);
            return LVar4;
          }
          break;
        }
      }
      plVar6 = (lysp_ext_instance *)((long)&plVar6->name + 1);
      ppcVar5 = ppcVar5 + 0xe;
    } while (plVar2 != plVar6);
  }
  __assert_fail("i < LY_ARRAY_COUNT(parsed_ext)",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_exts/structure.c"
                ,0x1fc,
                "LY_ERR structure_aug_sprinter_ctree(struct lysc_ext_instance *, const struct lyspr_tree_ctx *, const char **, const char **)"
               );
}

Assistant:

static LY_ERR
structure_aug_sprinter_ctree(struct lysc_ext_instance *ext, const struct lyspr_tree_ctx *ctx, const char **flags,
        const char **add_opts)
{
    LY_ERR rc = LY_SUCCESS;

    LY_ARRAY_COUNT_TYPE i;
    struct lysp_ext_instance *parsed_ext;

    assert(ctx);

    /* find the parsed ext structure */
    parsed_ext = ext->module->parsed->exts;
    LY_ARRAY_FOR(parsed_ext, i) {
        if (!strcmp(parsed_ext[i].name, "sx:augment-structure") && !strcmp(parsed_ext[i].argument, ext->argument)) {
            break;
        }
    }
    assert(i < LY_ARRAY_COUNT(parsed_ext));

    /* for augments print the parsed tree */
    rc = structure_aug_sprinter_ptree(parsed_ext, ctx, flags, add_opts);
    return rc;
}